

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O1

int ffgbytoff(fitsfile *fptr,long gsize,long ngroups,long offset,void *buffer,int *status)

{
  LONGLONG *pLVar1;
  FITSfile *pFVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  void *__dest;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  long local_68;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (fptr->Fptr->curbuf < 0) {
    ffldrc(fptr,fptr->Fptr->bytepos / 0xb40,0,status);
  }
  pFVar2 = fptr->Fptr;
  local_68 = pFVar2->bufrecnum[pFVar2->curbuf];
  lVar3 = local_68 * -0xb40 + pFVar2->bytepos;
  sVar9 = 0xb40 - lVar3;
  pcVar5 = pFVar2->iobuffer + lVar3 + (long)pFVar2->curbuf * 0xb40;
  if (1 < ngroups) {
    lVar3 = ngroups + -1;
    __dest = buffer;
    do {
      sVar6 = gsize;
      if ((long)sVar9 < gsize) {
        sVar6 = sVar9;
      }
      memcpy(__dest,pcVar5,sVar6);
      buffer = (void *)(sVar6 + (long)__dest);
      if ((long)sVar9 < gsize) {
        local_68 = local_68 + 1;
        ffldrc(fptr,local_68,0,status);
        pcVar5 = fptr->Fptr->iobuffer + (long)fptr->Fptr->curbuf * 0xb40;
        memcpy(buffer,pcVar5,gsize - sVar6);
        buffer = (void *)((long)__dest + gsize);
        lVar8 = (gsize - sVar6) + offset;
        pcVar5 = pcVar5 + lVar8;
        sVar9 = 0xb40 - lVar8;
      }
      else {
        pcVar5 = pcVar5 + sVar6 + offset;
        sVar9 = sVar9 - (sVar6 + offset);
      }
      if (sVar9 - 0xb41 < 0xfffffffffffff4c0) {
        if ((long)sVar9 < 1) {
          uVar4 = (0xb40 - sVar9) / 0xb40;
          uVar7 = -sVar9 % 0xb40;
        }
        else {
          uVar4 = -((sVar9 - 1) / 0xb40);
          uVar7 = ((sVar9 / 0xb40) * 0xb40 - sVar9) + 0xb40;
        }
        local_68 = local_68 + uVar4;
        ffldrc(fptr,local_68,0,status);
        sVar9 = 0xb40 - uVar7;
        pcVar5 = fptr->Fptr->iobuffer + uVar7 + (long)fptr->Fptr->curbuf * 0xb40;
      }
      lVar3 = lVar3 + -1;
      __dest = buffer;
    } while (lVar3 != 0);
  }
  sVar6 = gsize;
  if ((long)sVar9 < gsize) {
    sVar6 = sVar9;
  }
  memcpy(buffer,pcVar5,sVar6);
  if ((long)sVar9 < gsize) {
    ffldrc(fptr,local_68 + 1,0,status);
    memcpy((void *)((long)buffer + sVar6),fptr->Fptr->iobuffer + (long)fptr->Fptr->curbuf * 0xb40,
           gsize - sVar6);
  }
  pLVar1 = &fptr->Fptr->bytepos;
  *pLVar1 = *pLVar1 + (ngroups + -1) * offset + gsize * ngroups;
  return *status;
}

Assistant:

int ffgbytoff(fitsfile *fptr, /* I - FITS file pointer                   */
           long gsize,        /* I - size of each group of bytes         */
           long ngroups,      /* I - number of groups to read            */
           long offset,       /* I - size of gap between groups (may be < 0) */
           void *buffer,      /* I - buffer to be filled                 */
           int *status)       /* IO - error status                       */
/*
  get (read) the requested number of bytes from the file, starting at
  the current file position.  This function combines ffmbyt and ffgbyt
  for increased efficiency.
*/
{
    int bcurrent;
    long ii, bufpos, nspace, nread, record;
    char *cptr, *ioptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    cptr = (char *)buffer;
    bcurrent = (fptr->Fptr)->curbuf;     /* number of the current IO buffer */
    record = (fptr->Fptr)->bufrecnum[bcurrent];  /* zero-indexed record number */
    bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)record * IOBUFLEN)); /* start pos */
    nspace = IOBUFLEN - bufpos;  /* amount of space left in buffer */
    ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  

    for (ii = 1; ii < ngroups; ii++)  /* read all but the last group */
    {
      /* copy bytes from IO buffer to the user's buffer */
      nread = minvalue(gsize, nspace);
      memcpy(cptr, ioptr, nread);
      cptr += nread;          /* increment buffer pointer */

      if (nread < gsize)        /* entire group did not fit */
      {
        record++;
        ffldrc(fptr, record, REPORT_EOF, status);  /* load next record */
        bcurrent = (fptr->Fptr)->curbuf;
        ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

        nread  = gsize - nread;
        memcpy(cptr, ioptr, nread);
        cptr   += nread;            /* increment buffer pointer */
        ioptr  += (offset + nread); /* increment IO buffer pointer */
        nspace = IOBUFLEN - offset - nread;  /* amount of space left */
      }
      else
      {
        ioptr  += (offset + nread);  /* increment IO bufer pointer */
        nspace -= (offset + nread);
      }

      if (nspace <= 0 || nspace > IOBUFLEN) /* beyond current record? */
      {
        if (nspace <= 0)
        {
          record += ((IOBUFLEN - nspace) / IOBUFLEN); /* new record number */
          bufpos = (-nspace) % IOBUFLEN; /* starting buffer pos */
        }
        else
        {
          record -= ((nspace - 1 ) / IOBUFLEN); /* new record number */
          bufpos = IOBUFLEN - (nspace % IOBUFLEN); /* starting buffer pos */
        }

        ffldrc(fptr, record, REPORT_EOF, status);
        bcurrent = (fptr->Fptr)->curbuf;

        nspace = IOBUFLEN - bufpos;
        ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;
      }
    }

    /* now read the last group */
    nread = minvalue(gsize, nspace);
    memcpy(cptr, ioptr, nread);
    cptr += nread;          /* increment buffer pointer */

    if (nread < gsize)        /* entire group did not fit */
    {
      record++;
      ffldrc(fptr, record, REPORT_EOF, status);  /* load next record */
      bcurrent = (fptr->Fptr)->curbuf;
      ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

      nread  = gsize - nread;
      memcpy(cptr, ioptr, nread);
    }

    (fptr->Fptr)->bytepos = (fptr->Fptr)->bytepos + (ngroups * gsize)
                                  + (ngroups - 1) * offset;
    return(*status);
}